

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O2

void av1_cdef_search(AV1_COMP *cpi)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint8_t uVar4;
  CDEF_CONTROL CVar5;
  CDEF_PICK_METHOD pick_method;
  int iVar6;
  RefCntBuffer *pRVar7;
  YV12_BUFFER_CONFIG *pYVar8;
  SequenceHeader *pSVar9;
  uint64_t (*pauVar10) [64];
  MB_MODE_INFO *pMVar11;
  CommonModeInfoParams *pCVar12;
  bool bVar13;
  int stride;
  uint uVar14;
  CdefSearchCtx *cdef_search_ctx;
  code *pcVar15;
  int *piVar16;
  uint64_t (*pauVar17) [64];
  uint64_t uVar18;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  code *pcVar22;
  ulong uVar23;
  uint uVar24;
  size_t size;
  int iVar25;
  int iVar26;
  aom_internal_error_info *error_info;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  int c;
  ulong uVar30;
  int fbr;
  int pli;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  uint64_t best_tot_mse;
  long lVar34;
  bool bVar35;
  int local_124;
  ulong local_100;
  int best_lev0 [16];
  int best_lev1 [16];
  uint64_t (*mse [2]) [64];
  
  CVar5 = (cpi->oxcf).tool_cfg.cdef_control;
  if (CVar5 == CDEF_ADAPTIVE) {
    bVar13 = true;
    if ((((cpi->oxcf).mode != '\x02') || (((cpi->oxcf).rc_cfg.mode & ~AOM_CBR) != AOM_CQ)) ||
       (0x20 < (cpi->oxcf).rc_cfg.cq_level)) goto LAB_001e7184;
  }
  else if ((CVar5 != CDEF_REFERENCE) || ((cpi->ppi->rtc_ref).non_reference_frame == 0)) {
    bVar13 = false;
LAB_001e7184:
    if ((cpi->rc).rtc_external_ratectrl == 0) {
      pick_method = (cpi->sf).lpf_sf.cdef_pick_method;
      iVar26 = (cpi->common).quant_params.base_qindex;
      if ((ulong)pick_method != 6) {
        uVar4 = ((cpi->common).seq_params)->monochrome;
        cdef_search_ctx = cpi->cdef_search_ctx;
        if (cdef_search_ctx == (CdefSearchCtx *)0x0) {
          cdef_search_ctx = (CdefSearchCtx *)aom_malloc(0x1f28);
          cpi->cdef_search_ctx = cdef_search_ctx;
          if (cdef_search_ctx == (CdefSearchCtx *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate cpi->cdef_search_ctx");
            cdef_search_ctx = cpi->cdef_search_ctx;
          }
        }
        pRVar7 = (cpi->common).cur_frame;
        pYVar8 = cpi->source;
        pSVar9 = (cpi->common).seq_params;
        bVar35 = pSVar9->monochrome == '\0';
        uVar24 = bVar35 + 1 + (uint)bVar35;
        cdef_search_ctx->mi_params = &(cpi->common).mi_params;
        cdef_search_ctx->ref = pYVar8;
        uVar2 = (cpi->common).mi_params.mi_rows;
        uVar3 = (cpi->common).mi_params.mi_cols;
        cdef_search_ctx->nvfb = (int)(((uint)(uVar2 + 0xf >> 0x1f) >> 0x1c) + uVar2 + 0xf) >> 4;
        cdef_search_ctx->nhfb = (int)(((uint)(uVar3 + 0xf >> 0x1f) >> 0x1c) + uVar3 + 0xf) >> 4;
        cdef_search_ctx->coeff_shift = pSVar9->bit_depth - AOM_BITS_8;
        cdef_search_ctx->damping = ((cpi->common).quant_params.base_qindex >> 6) + 3;
        iVar6 = nb_cdef_strengths[pick_method];
        cdef_search_ctx->total_strengths = iVar6;
        cdef_search_ctx->num_planes = uVar24;
        cdef_search_ctx->pick_method = pick_method;
        cdef_search_ctx->sb_count = 0;
        cdef_search_ctx->use_highbitdepth = pSVar9->use_highbitdepth != '\0';
        av1_setup_dst_planes((cpi->td).mb.e_mbd.plane,pSVar9->sb_size,&pRVar7->buf,0,0,0,uVar24);
        lVar34 = 0x547a;
        for (uVar33 = 0; uVar24 != uVar33; uVar33 = uVar33 + 1) {
          piVar16 = (int *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar34 * 4
                           );
          iVar21 = piVar16[-1];
          cdef_search_ctx->xdec[uVar33] = iVar21;
          iVar25 = *piVar16;
          cdef_search_ctx->ydec[uVar33] = iVar25;
          bVar35 = iVar21 == 0;
          iVar21 = bVar35 + 1 + (uint)bVar35;
          if (iVar25 != 0) {
            iVar21 = (uint)bVar35 * 2;
          }
          cdef_search_ctx->bsize[uVar33] = iVar21;
          cdef_search_ctx->mi_wide_l2[uVar33] = 2 - piVar16[-1];
          cdef_search_ctx->mi_high_l2[uVar33] = 2 - *piVar16;
          memcpy((void *)((long)cdef_search_ctx + lVar34 * 4 + -0x151d8),piVar16 + -2,0xa30);
          lVar34 = lVar34 + 0x28c;
        }
        bVar35 = ((cpi->common).seq_params)->use_highbitdepth == '\0';
        pcVar15 = av1_cdef_copy_sb8_16_highbd;
        if (bVar35) {
          pcVar15 = av1_cdef_copy_sb8_16_lowbd;
        }
        pcVar22 = compute_cdef_dist_highbd;
        if (bVar35) {
          pcVar22 = compute_cdef_dist;
        }
        cdef_search_ctx->copy_fn = pcVar15;
        cdef_search_ctx->compute_cdef_dist_fn = pcVar22;
        lVar34 = (long)cdef_search_ctx->nhfb * (long)cdef_search_ctx->nvfb;
        piVar16 = (int *)aom_malloc(lVar34 * 4);
        cdef_search_ctx->sb_index = piVar16;
        if (piVar16 == (int *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cdef_search_ctx->sb_index");
        }
        cdef_search_ctx->sb_count = 0;
        size = lVar34 * 0x200;
        pauVar17 = (uint64_t (*) [64])aom_malloc(size);
        cdef_search_ctx->mse[0] = pauVar17;
        if (pauVar17 == (uint64_t (*) [64])0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cdef_search_ctx->mse[0]");
        }
        pauVar17 = (uint64_t (*) [64])aom_malloc(size);
        cdef_search_ctx->mse[1] = pauVar17;
        if (pauVar17 == (uint64_t (*) [64])0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cdef_search_ctx->mse[1]");
        }
        if ((cpi->mt_info).num_workers < 2) {
          iVar21 = 0;
          for (uVar24 = 0; (int)uVar24 < cdef_search_ctx->nvfb; uVar24 = uVar24 + 1) {
            iVar25 = 0;
            lVar34 = 0;
            for (uVar33 = 0; (long)uVar33 < (long)cdef_search_ctx->nhfb; uVar33 = uVar33 + 1) {
              pCVar12 = cdef_search_ctx->mi_params;
              iVar31 = pCVar12->mi_stride;
              uVar32 = pCVar12->mi_rows + uVar24 * -0x10;
              if (0xf < (int)uVar32) {
                uVar32 = 0x10;
              }
              error_info = (aom_internal_error_info *)0x0;
              uVar14 = 0;
              if (0 < (int)uVar32) {
                uVar14 = uVar32;
              }
              lVar28 = lVar34 + (long)(iVar21 * iVar31) * 8 + (long)pCVar12->mi_grid_base;
              uVar29 = pCVar12->mi_cols + iVar25;
              if (0xf < (int)uVar29) {
                uVar29 = 0x10;
              }
              pMVar11 = pCVar12->mi_grid_base[uVar33 * 0x10 + (long)(int)(iVar31 * uVar24 * 0x10)];
              uVar19 = (ulong)uVar29;
              if ((int)uVar29 < 1) {
                uVar19 = 0;
              }
              while (uVar29 = (uint)error_info, uVar29 != uVar14) {
                uVar27 = 0;
                while (uVar19 != uVar27) {
                  lVar1 = uVar27 * 8;
                  uVar27 = uVar27 + 1;
                  if (*(char *)(*(long *)(lVar28 + lVar1) + 0x90) == '\0') {
                    if ((((int)uVar29 < (int)uVar32) &&
                        (((uVar33 & 1) == 0 || ((pMVar11->bsize & ~BLOCK_4X8) != BLOCK_128X64)))) &&
                       (((uVar24 & 1) == 0 || ((pMVar11->bsize - BLOCK_64X128 & 0xfd) != 0)))) {
                      av1_cdef_mse_calc_block
                                (cdef_search_ctx,error_info,uVar24,(int)uVar33,
                                 cdef_search_ctx->sb_count);
                      cdef_search_ctx->sb_count = cdef_search_ctx->sb_count + 1;
                    }
                    goto LAB_001e7b09;
                  }
                }
                lVar28 = lVar28 + (long)iVar31 * 8;
                error_info = (aom_internal_error_info *)(ulong)(uVar29 + 1);
              }
LAB_001e7b09:
              lVar34 = lVar34 + 0x80;
              iVar25 = iVar25 + -0x10;
            }
            iVar21 = iVar21 + 0x10;
          }
        }
        else {
          av1_cdef_mse_calc_frame_mt(cpi);
        }
        uVar24 = cdef_search_ctx->sb_count;
        pauVar17 = cdef_search_ctx->mse[0];
        mse[0] = pauVar17;
        pauVar10 = cdef_search_ctx->mse[1];
        iVar21 = 1;
        if (uVar4 == '\0') {
          iVar21 = iVar6;
        }
        uVar32 = iVar21 * iVar6 - 1;
        uVar14 = 0x1f;
        if (uVar32 != 0) {
          for (; uVar32 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        uVar32 = (uVar14 ^ 0xffffffe0) + 0x21;
        if (iVar21 * iVar6 == 1) {
          uVar32 = 0;
        }
        mse[1] = pauVar10;
        iVar6 = (cpi->td).mb.rdmult;
        uVar14 = 3;
        if (uVar32 < 3) {
          uVar14 = uVar32;
        }
        piVar16 = (cpi->common).cdef_info.cdef_uv_strengths;
        local_100 = 0xffffffffffffffff;
        local_124 = 0;
        for (iVar21 = 0; iVar21 != uVar14 + 1; iVar21 = iVar21 + 1) {
          bVar20 = (byte)iVar21;
          iVar31 = 1 << (bVar20 & 0x1f);
          best_lev0[0xc] = 0;
          best_lev0[0xd] = 0;
          best_lev0[0xe] = 0;
          best_lev0[0xf] = 0;
          best_lev0[8] = 0;
          best_lev0[9] = 0;
          best_lev0[10] = 0;
          best_lev0[0xb] = 0;
          best_lev0[4] = 0;
          best_lev0[5] = 0;
          best_lev0[6] = 0;
          best_lev0[7] = 0;
          best_lev0[0] = 0;
          best_lev0[1] = 0;
          best_lev0[2] = 0;
          best_lev0[3] = 0;
          best_lev1[0xc] = 0;
          best_lev1[0xd] = 0;
          best_lev1[0xe] = 0;
          best_lev1[0xf] = 0;
          best_lev1[8] = 0;
          best_lev1[9] = 0;
          best_lev1[10] = 0;
          best_lev1[0xb] = 0;
          best_lev1[4] = 0;
          best_lev1[5] = 0;
          best_lev1[6] = 0;
          best_lev1[7] = 0;
          best_lev1[0] = 0;
          best_lev1[1] = 0;
          best_lev1[2] = 0;
          best_lev1[3] = 0;
          iVar25 = 0;
          uVar18 = 0;
          if (uVar4 == '\0') {
            for (; iVar31 != iVar25; iVar25 = iVar25 + 1) {
              uVar18 = search_one_dual(best_lev0,best_lev1,iVar25,mse,uVar24,pick_method);
            }
            uVar32 = iVar31 - 1;
            iVar25 = 0;
            uVar33 = 0;
            if (0 < (int)uVar32) {
              uVar33 = (ulong)uVar32;
            }
            for (; iVar25 != 4 << (bVar20 & 0x1f); iVar25 = iVar25 + 1) {
              for (uVar19 = 0; uVar33 != uVar19; uVar19 = uVar19 + 1) {
                best_lev0[uVar19] = best_lev0[uVar19 + 1];
                best_lev1[uVar19] = best_lev1[uVar19 + 1];
              }
              uVar18 = search_one_dual(best_lev0,best_lev1,uVar32,mse,uVar24,pick_method);
            }
            iVar25 = 2;
          }
          else {
            for (; iVar31 != iVar25; iVar25 = iVar25 + 1) {
              uVar18 = search_one(best_lev0,iVar25,pauVar17,uVar24,pick_method);
            }
            if (pick_method - CDEF_FAST_SEARCH_LVL1 < 5) {
              iVar25 = 1;
            }
            else {
              uVar32 = iVar31 - 1;
              uVar33 = 0;
              iVar25 = 0;
              if (0 < (int)uVar32) {
                uVar33 = (ulong)uVar32;
                iVar25 = 0;
              }
              for (; iVar25 != 4 << (bVar20 & 0x1f); iVar25 = iVar25 + 1) {
                for (uVar19 = 0; uVar33 != uVar19; uVar19 = uVar19 + 1) {
                  best_lev0[uVar19] = best_lev0[uVar19 + 1];
                }
                uVar18 = search_one(best_lev0,uVar32,pauVar17,uVar24,pick_method);
              }
              iVar25 = 1;
            }
          }
          uVar33 = uVar18 * 0x800 +
                   ((long)(int)(((6 << (bVar20 & 0x1f)) * iVar25 + iVar21 * uVar24) * 0x200) *
                    (long)iVar6 >> 9);
          if (uVar33 < local_100) {
            uVar19 = (ulong)(uint)(4 << (bVar20 & 0x1f));
            memcpy((cpi->common).cdef_info.cdef_strengths,best_lev0,uVar19);
            local_124 = iVar21;
            local_100 = uVar33;
            if (uVar4 == '\0') {
              memcpy(piVar16,best_lev1,uVar19);
            }
          }
        }
        bVar20 = (byte)local_124 & 0x1f;
        (cpi->common).cdef_info.cdef_bits = local_124;
        (cpi->common).cdef_info.nb_cdef_strengths = 1 << bVar20;
        uVar32 = 0 << bVar20;
        uVar33 = (ulong)uVar32;
        if ((int)uVar24 < 1) {
          uVar24 = uVar32;
        }
        for (; uVar33 != uVar24; uVar33 = uVar33 + 1) {
          uVar32 = (cpi->common).cdef_info.nb_cdef_strengths;
          uVar27 = 0;
          uVar19 = (ulong)uVar32;
          if ((int)uVar32 < 1) {
            uVar19 = uVar27;
          }
          uVar23 = 0;
          uVar30 = 0xffffffffffffffff;
          for (; uVar19 != uVar27; uVar27 = uVar27 + 1) {
            uVar18 = pauVar17[uVar33][(cpi->common).cdef_info.cdef_strengths[uVar27]];
            if (uVar4 == '\0') {
              uVar18 = uVar18 + pauVar10[uVar33][piVar16[uVar27]];
            }
            if (uVar18 < uVar30) {
              uVar23 = uVar27 & 0xffffffff;
              uVar30 = uVar18;
            }
          }
          pMVar11 = (cpi->common).mi_params.mi_grid_base[cdef_search_ctx->sb_index[uVar33]];
          *(ushort *)&pMVar11->field_0xa7 =
               *(ushort *)&pMVar11->field_0xa7 & 0x87ff | (ushort)(((uint)uVar23 & 0xf) << 0xb);
        }
        if (pick_method - CDEF_FAST_SEARCH_LVL1 < 5) {
          uVar24 = (cpi->common).cdef_info.nb_cdef_strengths;
          uVar19 = 0;
          uVar33 = (ulong)uVar24;
          if ((int)uVar24 < 1) {
            uVar33 = uVar19;
          }
          for (; uVar33 != uVar19; uVar19 = uVar19 + 1) {
            iVar6 = piVar16[uVar19];
            get_cdef_filter_strengths
                      (pick_method,best_lev0,best_lev1,
                       (cpi->common).cdef_info.cdef_strengths[uVar19]);
            (cpi->common).cdef_info.cdef_strengths[uVar19] = best_lev0[0] * 4 + best_lev1[0];
            get_cdef_filter_strengths(pick_method,best_lev0,best_lev1,iVar6);
            piVar16[uVar19] = best_lev0[0] * 4 + best_lev1[0];
          }
        }
        if ((((bVar13) && ((cpi->oxcf).mode == '\x02')) &&
            (((cpi->oxcf).rc_cfg.mode & ~AOM_CBR) == AOM_CQ)) &&
           ((cpi->oxcf).rc_cfg.cq_level < 0xdd)) {
          uVar24 = (cpi->common).cdef_info.nb_cdef_strengths;
          uVar19 = 0;
          uVar33 = (ulong)uVar24;
          if ((int)uVar24 < 1) {
            uVar33 = uVar19;
          }
          for (; uVar33 != uVar19; uVar19 = uVar19 + 1) {
            iVar6 = (cpi->common).cdef_info.cdef_strengths[uVar19];
            iVar21 = piVar16[uVar19];
            (cpi->common).cdef_info.cdef_strengths[uVar19] =
                 (iVar6 % 4 >> 1) + (iVar6 / 4 & 0xfffffffeU) * 2;
            piVar16[uVar19] = (iVar21 % 4 >> 1) + (iVar21 / 4 & 0xfffffffeU) * 2;
          }
        }
        (cpi->common).cdef_info.cdef_damping = (iVar26 >> 6) + 3;
        av1_cdef_dealloc_data(cdef_search_ctx);
        return;
      }
      iVar6 = (cpi->sf).rt_sf.screen_content_cdef_filter_qindex_thresh;
      iVar21 = (cpi->rc).best_quality + 5;
      if (iVar21 < iVar6) {
        iVar21 = iVar6;
      }
      uVar24 = 0;
      if (iVar21 < iVar26) {
        uVar24 = (uint)((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN);
      }
      iVar26 = (cpi->sf).rt_sf.skip_cdef_sb;
    }
    else {
      iVar26 = 0;
      uVar24 = 0;
    }
    av1_pick_cdef_from_qp(&cpi->common,iVar26,uVar24);
    return;
  }
  (cpi->common).cdef_info.nb_cdef_strengths = 1;
  (cpi->common).cdef_info.cdef_strengths[0] = 0;
  (cpi->common).cdef_info.cdef_bits = 0;
  (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
  return;
}

Assistant:

void av1_cdef_search(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CDEF_CONTROL cdef_control = cpi->oxcf.tool_cfg.cdef_control;

  assert(cdef_control != CDEF_NONE);
  // For CDEF_ADAPTIVE, turning off CDEF around qindex 32 was best for still
  // pictures
  if ((cdef_control == CDEF_REFERENCE &&
       cpi->ppi->rtc_ref.non_reference_frame) ||
      (cdef_control == CDEF_ADAPTIVE && cpi->oxcf.mode == ALLINTRA &&
       (cpi->oxcf.rc_cfg.mode == AOM_Q || cpi->oxcf.rc_cfg.mode == AOM_CQ) &&
       cpi->oxcf.rc_cfg.cq_level <= 32)) {
    CdefInfo *const cdef_info = &cm->cdef_info;
    cdef_info->nb_cdef_strengths = 1;
    cdef_info->cdef_bits = 0;
    cdef_info->cdef_strengths[0] = 0;
    cdef_info->cdef_uv_strengths[0] = 0;
    return;
  }

  // Indicate if external RC is used for testing
  const int rtc_ext_rc = cpi->rc.rtc_external_ratectrl;
  if (rtc_ext_rc) {
    av1_pick_cdef_from_qp(cm, 0, 0);
    return;
  }
  CDEF_PICK_METHOD pick_method = cpi->sf.lpf_sf.cdef_pick_method;
  if (pick_method == CDEF_PICK_FROM_Q) {
    const int use_screen_content_model =
        cm->quant_params.base_qindex >
            AOMMAX(cpi->sf.rt_sf.screen_content_cdef_filter_qindex_thresh,
                   cpi->rc.best_quality + 5) &&
        cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
    av1_pick_cdef_from_qp(cm, cpi->sf.rt_sf.skip_cdef_sb,
                          use_screen_content_model);
    return;
  }
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int damping = 3 + (cm->quant_params.base_qindex >> 6);
  const int fast = (pick_method >= CDEF_FAST_SEARCH_LVL1 &&
                    pick_method <= CDEF_FAST_SEARCH_LVL5);
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &cpi->td.mb.e_mbd;

  if (!cpi->cdef_search_ctx)
    CHECK_MEM_ERROR(cm, cpi->cdef_search_ctx,
                    aom_malloc(sizeof(*cpi->cdef_search_ctx)));
  CdefSearchCtx *cdef_search_ctx = cpi->cdef_search_ctx;

  // Initialize parameters related to CDEF search context.
  cdef_params_init(&cm->cur_frame->buf, cpi->source, cm, xd, cdef_search_ctx,
                   pick_method);
  // Allocate CDEF search context buffers.
  cdef_alloc_data(cm, cdef_search_ctx);
  // Frame level mse calculation.
  if (cpi->mt_info.num_workers > 1) {
    av1_cdef_mse_calc_frame_mt(cpi);
  } else {
    cdef_mse_calc_frame(cdef_search_ctx, cm->error);
  }

  /* Search for different number of signaling bits. */
  int nb_strength_bits = 0;
  uint64_t best_rd = UINT64_MAX;
  CdefInfo *const cdef_info = &cm->cdef_info;
  int sb_count = cdef_search_ctx->sb_count;
  uint64_t(*mse[2])[TOTAL_STRENGTHS];
  mse[0] = cdef_search_ctx->mse[0];
  mse[1] = cdef_search_ctx->mse[1];
  /* Calculate the maximum number of bits required to signal CDEF strengths at
   * block level */
  const int total_strengths = nb_cdef_strengths[pick_method];
  const int joint_strengths =
      num_planes > 1 ? total_strengths * total_strengths : total_strengths;
  const int max_signaling_bits =
      joint_strengths == 1 ? 0 : get_msb(joint_strengths - 1) + 1;
  int rdmult = cpi->td.mb.rdmult;
  for (int i = 0; i <= 3; i++) {
    if (i > max_signaling_bits) break;
    int best_lev0[CDEF_MAX_STRENGTHS] = { 0 };
    int best_lev1[CDEF_MAX_STRENGTHS] = { 0 };
    const int nb_strengths = 1 << i;
    uint64_t tot_mse;
    if (num_planes > 1) {
      tot_mse = joint_strength_search_dual(best_lev0, best_lev1, nb_strengths,
                                           mse, sb_count, pick_method);
    } else {
      tot_mse = joint_strength_search(best_lev0, nb_strengths, mse[0], sb_count,
                                      pick_method);
    }

    const int total_bits = sb_count * i + nb_strengths * CDEF_STRENGTH_BITS *
                                              (num_planes > 1 ? 2 : 1);
    const int rate_cost = av1_cost_literal(total_bits);
    const uint64_t dist = tot_mse * 16;
    const uint64_t rd = RDCOST(rdmult, rate_cost, dist);
    if (rd < best_rd) {
      best_rd = rd;
      nb_strength_bits = i;
      memcpy(cdef_info->cdef_strengths, best_lev0,
             nb_strengths * sizeof(best_lev0[0]));
      if (num_planes > 1) {
        memcpy(cdef_info->cdef_uv_strengths, best_lev1,
               nb_strengths * sizeof(best_lev1[0]));
      }
    }
  }

  cdef_info->cdef_bits = nb_strength_bits;
  cdef_info->nb_cdef_strengths = 1 << nb_strength_bits;
  for (int i = 0; i < sb_count; i++) {
    uint64_t best_mse = UINT64_MAX;
    int best_gi = 0;
    for (int gi = 0; gi < cdef_info->nb_cdef_strengths; gi++) {
      uint64_t curr = mse[0][i][cdef_info->cdef_strengths[gi]];
      if (num_planes > 1) curr += mse[1][i][cdef_info->cdef_uv_strengths[gi]];
      if (curr < best_mse) {
        best_gi = gi;
        best_mse = curr;
      }
    }
    mi_params->mi_grid_base[cdef_search_ctx->sb_index[i]]->cdef_strength =
        best_gi;
  }
  if (fast) {
    for (int j = 0; j < cdef_info->nb_cdef_strengths; j++) {
      const int luma_strength = cdef_info->cdef_strengths[j];
      const int chroma_strength = cdef_info->cdef_uv_strengths[j];
      int pri_strength, sec_strength;

      STORE_CDEF_FILTER_STRENGTH(cdef_info->cdef_strengths[j], pick_method,
                                 luma_strength);
      STORE_CDEF_FILTER_STRENGTH(cdef_info->cdef_uv_strengths[j], pick_method,
                                 chroma_strength);
    }
  }

  // For CDEF_ADAPTIVE, set primary and secondary CDEF at reduced strength for
  // qindexes 33 through 220.
  // Note 1: for odd strengths, the 0.5 discarded by ">> 1" is a significant
  // part of the strength when the strength is small, and because there are
  // few strength levels, odd strengths are reduced significantly more than a
  // half. This is intended behavior for reduced strength.
  // For example: a pri strength of 3 becomes 1, and a sec strength of 1
  // becomes 0.
  // Note 2: a (signaled) sec strength value of 3 is special as it results in an
  // actual sec strength of 4. We tried adding +1 to the sec strength 3 so it
  // maps to a reduced sec strength of 2. However, on Daala's subset1, the
  // resulting SSIMULACRA 2 scores were either exactly the same (at cpu-used 6),
  // or within noise level (at cpu-used 3). Given that there were no discernible
  // improvements, this special mapping was left out for reduced strength.
  if (cdef_control == CDEF_ADAPTIVE && cpi->oxcf.mode == ALLINTRA &&
      (cpi->oxcf.rc_cfg.mode == AOM_Q || cpi->oxcf.rc_cfg.mode == AOM_CQ) &&
      cpi->oxcf.rc_cfg.cq_level <= 220) {
    for (int j = 0; j < cdef_info->nb_cdef_strengths; j++) {
      const int luma_strength = cdef_info->cdef_strengths[j];
      const int chroma_strength = cdef_info->cdef_uv_strengths[j];

      const int new_pri_luma_strength =
          (luma_strength / CDEF_SEC_STRENGTHS) >> 1;
      const int new_sec_luma_strength =
          (luma_strength % CDEF_SEC_STRENGTHS) >> 1;
      const int new_pri_chroma_strength =
          (chroma_strength / CDEF_SEC_STRENGTHS) >> 1;
      const int new_sec_chroma_strength =
          (chroma_strength % CDEF_SEC_STRENGTHS) >> 1;

      cdef_info->cdef_strengths[j] =
          new_pri_luma_strength * CDEF_SEC_STRENGTHS + new_sec_luma_strength;
      cdef_info->cdef_uv_strengths[j] =
          new_pri_chroma_strength * CDEF_SEC_STRENGTHS +
          new_sec_chroma_strength;
    }
  }

  cdef_info->cdef_damping = damping;
  // Deallocate CDEF search context buffers.
  av1_cdef_dealloc_data(cdef_search_ctx);
}